

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttkern.c
# Opt level: O3

FT_Error tt_face_load_kern(TT_Face face,FT_Stream stream)

{
  ushort uVar1;
  FT_Error FVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong in_RAX;
  uint uVar6;
  uint uVar7;
  long lVar8;
  FT_Byte *pFVar9;
  FT_UInt32 FVar10;
  FT_UInt32 FVar11;
  uint uVar12;
  FT_Byte *pFVar13;
  FT_Byte *pFVar14;
  FT_ULong table_size;
  ulong local_38;
  
  local_38 = in_RAX;
  FVar2 = (*face->goto_table)(face,0x6b65726e,stream,&local_38);
  if (((FVar2 == 0) && (FVar2 = 0x8e, 3 < local_38)) &&
     (FVar2 = FT_Stream_ExtractFrame(stream,local_38,&face->kern_table), FVar2 == 0)) {
    face->kern_table_size = local_38;
    pFVar14 = face->kern_table;
    uVar1 = *(ushort *)(pFVar14 + 2) << 8 | *(ushort *)(pFVar14 + 2) >> 8;
    FVar2 = 0;
    FVar10 = 0;
    FVar11 = 0;
    uVar3 = 0;
    if (uVar1 != 0) {
      pFVar9 = pFVar14 + local_38;
      uVar12 = 0x20;
      if (uVar1 < 0x20) {
        uVar12 = (uint)uVar1;
      }
      uVar6 = 0;
      FVar11 = 0;
      FVar10 = 0;
      pFVar14 = pFVar14 + 4;
      do {
        uVar7 = 1 << ((byte)uVar6 & 0x1f);
        uVar3 = uVar6;
        if ((pFVar9 < pFVar14 + 6) ||
           (uVar1 = *(ushort *)(pFVar14 + 2) << 8 | *(ushort *)(pFVar14 + 2) >> 8, uVar1 < 0xf))
        break;
        pFVar13 = pFVar14 + uVar1;
        if (pFVar9 < pFVar14 + uVar1) {
          pFVar13 = pFVar9;
        }
        if (pFVar14 + 0xe <= pFVar13 && ((pFVar14[5] & 3) == 1 && pFVar14[4] == '\0')) {
          uVar1 = *(ushort *)(pFVar14 + 6) << 8 | *(ushort *)(pFVar14 + 6) >> 8;
          lVar8 = (long)pFVar13 - (long)(pFVar14 + 0xe);
          uVar3 = (uint)(lVar8 / 6);
          if ((long)(ulong)((uint)uVar1 * 6) <= lVar8) {
            uVar3 = (uint)uVar1;
          }
          FVar11 = FVar11 | uVar7;
          if (uVar3 != 0) {
            if (uVar3 - 1 != 0) {
              uVar4 = *(uint *)(pFVar14 + 0xe);
              lVar8 = 0;
              uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                      uVar4 << 0x18;
              do {
                uVar5 = *(uint *)(pFVar14 + lVar8 + 0x14);
                uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                        uVar5 << 0x18;
                if (uVar5 < uVar4) goto LAB_00243f81;
                lVar8 = lVar8 + 6;
                uVar4 = uVar5;
              } while ((ulong)(uVar3 - 1) * 6 != lVar8);
            }
            FVar10 = FVar10 | uVar7;
          }
        }
LAB_00243f81:
        uVar6 = uVar6 + 1;
        pFVar14 = pFVar13;
        uVar3 = uVar12;
      } while (uVar6 != uVar12);
    }
    face->num_kern_tables = uVar3;
    face->kern_avail_bits = FVar11;
    face->kern_order_bits = FVar10;
  }
  return FVar2;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_kern( TT_Face    face,
                     FT_Stream  stream )
  {
    FT_Error   error;
    FT_ULong   table_size;
    FT_Byte*   p;
    FT_Byte*   p_limit;
    FT_UInt    nn, num_tables;
    FT_UInt32  avail = 0, ordered = 0;


    /* the kern table is optional; exit silently if it is missing */
    error = face->goto_table( face, TTAG_kern, stream, &table_size );
    if ( error )
      goto Exit;

    if ( table_size < 4 )  /* the case of a malformed table */
    {
      FT_ERROR(( "tt_face_load_kern:"
                 " kerning table is too small - ignored\n" ));
      error = FT_THROW( Table_Missing );
      goto Exit;
    }

    if ( FT_FRAME_EXTRACT( table_size, face->kern_table ) )
    {
      FT_ERROR(( "tt_face_load_kern:"
                 " could not extract kerning table\n" ));
      goto Exit;
    }

    face->kern_table_size = table_size;

    p       = face->kern_table;
    p_limit = p + table_size;

    p         += 2; /* skip version */
    num_tables = FT_NEXT_USHORT( p );

    if ( num_tables > 32 ) /* we only support up to 32 sub-tables */
      num_tables = 32;

    for ( nn = 0; nn < num_tables; nn++ )
    {
      FT_UInt    num_pairs, length, coverage, format;
      FT_Byte*   p_next;
      FT_UInt32  mask = (FT_UInt32)1UL << nn;


      if ( p + 6 > p_limit )
        break;

      p_next = p;

      p       += 2; /* skip version */
      length   = FT_NEXT_USHORT( p );
      coverage = FT_NEXT_USHORT( p );

      if ( length <= 6 + 8 )
        break;

      p_next += length;

      if ( p_next > p_limit )  /* handle broken table */
        p_next = p_limit;

      format = coverage >> 8;

      /* we currently only support format 0 kerning tables */
      if ( format != 0 )
        goto NextTable;

      /* only use horizontal kerning tables */
      if ( ( coverage & 3U ) != 0x0001 ||
           p + 8 > p_next              )
        goto NextTable;

      num_pairs = FT_NEXT_USHORT( p );
      p        += 6;

      if ( ( p_next - p ) < 6 * (int)num_pairs ) /* handle broken count */
        num_pairs = (FT_UInt)( ( p_next - p ) / 6 );

      avail |= mask;

      /*
       * Now check whether the pairs in this table are ordered.
       * We then can use binary search.
       */
      if ( num_pairs > 0 )
      {
        FT_ULong  count;
        FT_ULong  old_pair;


        old_pair = FT_NEXT_ULONG( p );
        p       += 2;

        for ( count = num_pairs - 1; count > 0; count-- )
        {
          FT_UInt32  cur_pair;


          cur_pair = FT_NEXT_ULONG( p );
          if ( cur_pair < old_pair )
            break;

          p += 2;
          old_pair = cur_pair;
        }

        if ( count == 0 )
          ordered |= mask;
      }

    NextTable:
      p = p_next;
    }

    face->num_kern_tables = nn;
    face->kern_avail_bits = avail;
    face->kern_order_bits = ordered;

  Exit:
    return error;
  }